

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

char * ps_astar_hyp(ps_astar_t *nbest,ps_latpath_t *path)

{
  ps_search_t *ppVar1;
  int iVar2;
  size_t sVar3;
  glist_t pgVar4;
  char *local_68;
  char *local_60;
  char *wstr_1;
  char *wstr;
  char *hyp;
  char *c;
  size_t len;
  ps_latpath_t *p;
  ps_search_t *search;
  ps_latpath_t *path_local;
  ps_astar_t *nbest_local;
  
  ppVar1 = nbest->dag->search;
  c = (char *)0x0;
  for (len = (size_t)path; len != 0; len = *(size_t *)(len + 8)) {
    iVar2 = dict_real_word(ppVar1->dict,*(s3wid_t *)(*(long *)len + 8));
    if (iVar2 != 0) {
      if (*(int *)(*(long *)len + 8) < 0) {
        local_60 = (char *)0x0;
      }
      else {
        local_60 = ppVar1->dict->word[*(int *)(*(long *)len + 8)].word;
      }
      if (local_60 != (char *)0x0) {
        sVar3 = strlen(local_60);
        c = c + sVar3 + 1;
      }
    }
  }
  if (c == (char *)0x0) {
    nbest_local = (ps_astar_t *)0x0;
  }
  else {
    nbest_local = (ps_astar_t *)
                  __ckd_calloc__(1,(size_t)c,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                 ,0x727);
    hyp = c + (long)((long)&nbest_local[-1].latpath_alloc + 7);
    for (len = (size_t)path; len != 0; len = *(size_t *)(len + 8)) {
      iVar2 = dict_real_word(ppVar1->dict,*(s3wid_t *)(*(long *)len + 8));
      if (iVar2 != 0) {
        if (*(int *)(*(long *)len + 8) < 0) {
          local_68 = (char *)0x0;
        }
        else {
          local_68 = ppVar1->dict->word[*(int *)(*(long *)len + 8)].word;
        }
        if (local_68 != (char *)0x0) {
          sVar3 = strlen(local_68);
          hyp = hyp + -sVar3;
          memcpy(hyp,local_68,sVar3);
          if (nbest_local < hyp) {
            hyp = (char *)((long)&((ps_astar_t *)((long)hyp + -0x60))->latpath_alloc + 7);
            *hyp = ' ';
          }
        }
      }
    }
    pgVar4 = glist_add_ptr(nbest->hyps,nbest_local);
    nbest->hyps = pgVar4;
  }
  return (char *)nbest_local;
}

Assistant:

char const *
ps_astar_hyp(ps_astar_t *nbest, ps_latpath_t *path)
{
    ps_search_t *search;
    ps_latpath_t *p;
    size_t len;
    char *c;
    char *hyp;

    search = nbest->dag->search;

    /* Backtrace once to get hypothesis length. */
    len = 0;
    for (p = path; p; p = p->parent) {
        if (dict_real_word(ps_search_dict(search), p->node->basewid)) {
    	    char *wstr = dict_wordstr(ps_search_dict(search), p->node->basewid);
    	    if (wstr != NULL)
    	        len += strlen(wstr) + 1;
        }
    }

    if (len == 0) {
	return NULL;
    }

    /* Backtrace again to construct hypothesis string. */
    hyp = ckd_calloc(1, len);
    c = hyp + len - 1;
    for (p = path; p; p = p->parent) {
        if (dict_real_word(ps_search_dict(search), p->node->basewid)) {
    	    char *wstr = dict_wordstr(ps_search_dict(search), p->node->basewid);
    	    if (wstr != NULL) {
	        len = strlen(wstr);
    		c -= len;
        	memcpy(c, wstr, len);
    		if (c > hyp) {
            	    --c;
        	    *c = ' ';
    		}
    	    }
        }
    }

    nbest->hyps = glist_add_ptr(nbest->hyps, hyp);
    return hyp;
}